

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_pad_dists(Omega_h *this,Mesh *mesh,Int pad_dim,Read<signed_char> *edges_are_bridges)

{
  Int IVar1;
  void *extraout_RDX;
  Write<signed_char> *this_00;
  Reals RVar2;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  Write<signed_char> local_30;
  
  if (pad_dim == 3) {
    this_00 = &local_80;
    Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
    get_tet_pad_dists(this,mesh,(Read<signed_char> *)this_00);
  }
  else if (pad_dim == 2) {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 3) {
      this_00 = &local_60;
      Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
      get_tri_pad_dists<3>(this,mesh,(Read<signed_char> *)this_00);
    }
    else {
      IVar1 = Mesh::dim(mesh);
      if (IVar1 != 2) goto LAB_002645b3;
      this_00 = &local_70;
      Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
      get_tri_pad_dists<2>(this,mesh,(Read<signed_char> *)this_00);
    }
  }
  else {
    if (pad_dim != 1) {
LAB_002645b3:
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_confined.cpp"
           ,0xb5);
    }
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 3) {
      this_00 = &local_30;
      Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
      get_edge_pad_dists<3>(this,mesh,(Read<signed_char> *)this_00);
    }
    else {
      IVar1 = Mesh::dim(mesh);
      if (IVar1 == 2) {
        this_00 = &local_40;
        Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
        get_edge_pad_dists<2>(this,mesh,(Read<signed_char> *)this_00);
      }
      else {
        IVar1 = Mesh::dim(mesh);
        if (IVar1 != 1) goto LAB_002645b3;
        this_00 = &local_50;
        Write<signed_char>::Write(this_00,&edges_are_bridges->write_);
        get_edge_pad_dists<1>(this,mesh,(Read<signed_char> *)this_00);
      }
    }
  }
  Write<signed_char>::~Write(this_00);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_pad_dists(Mesh* mesh, Int pad_dim, Read<I8> edges_are_bridges) {
  if (pad_dim == EDGE) {
    if (mesh->dim() == 3) {
      return get_edge_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_edge_pad_dists<2>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 1) {
      return get_edge_pad_dists<1>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == FACE) {
    if (mesh->dim() == 3) {
      return get_tri_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_tri_pad_dists<2>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == REGION) {
    return get_tet_pad_dists(mesh, edges_are_bridges);
  }
  OMEGA_H_NORETURN(Reals());
}